

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CGetFieldByThisExpression *exp)

{
  string *currentClassName;
  _Alloc_hider _Var1;
  ISubtreeWrapper *_wrapper;
  IAddress *pIVar2;
  allocator local_49;
  string local_48;
  shared_ptr<VariableInfo> varInfo;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CGetFieldByThisExpression\n");
  _wrapper = (ISubtreeWrapper *)operator_new(0x10);
  pIVar2 = IRT::CFrame::GetClassFieldAddress
                     (this->currentFrame,
                      &((exp->fieldIdentifier)._M_t.
                        super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                        super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                        super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
  (*pIVar2->_vptr_IAddress[2])(&local_48,pIVar2);
  _Var1._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b478;
  _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)_Var1._M_p;
  updateSubtreeWrapper(this,_wrapper);
  if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_dataplus._M_p + 0x10))();
  }
  currentClassName = (string *)this->symbolTable;
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  getVariableInfoFromLocalArgAndFields
            ((SymbolTable *)&varInfo,currentClassName,&this->currentClassName,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((((varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type).
       super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isPrimitive == true) {
    std::__cxx11::string::assign((char *)&this->currentObjectClassName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->currentObjectClassName);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void CBuildVisitor::Visit( CGetFieldByThisExpression &exp ) {
    std::cout << "IRT builder: CGetFieldByThisExpression\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( currentFrame->GetClassFieldAddress( exp.fieldIdentifier->name )->ToExpression( ))));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable,
                                                         currentClassName,
                                                         "",
                                                         exp.fieldIdentifier->name );

    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}